

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

void __thiscall QString::resize(QString *this,qsizetype size)

{
  Data *pDVar1;
  long alloc;
  
  alloc = 0;
  if (0 < size) {
    alloc = size;
  }
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc -
      ((long)((long)(this->d).ptr -
             ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <
      alloc)) {
    reallocData(this,alloc,Grow);
    pDVar1 = (this->d).d;
    (this->d).size = alloc;
    if (pDVar1 == (Data *)0x0) {
      return;
    }
  }
  else {
    (this->d).size = alloc;
  }
  if ((pDVar1->super_QArrayData).alloc != 0) {
    (this->d).ptr[alloc] = L'\0';
  }
  return;
}

Assistant:

void QString::resize(qsizetype size)
{
    if (size < 0)
        size = 0;

    if (d->needsDetach() || needsReallocate(*this, size))
        reallocData(size, QArrayData::Grow);
    d.size = size;
    if (d->allocatedCapacity())
        d.data()[size] = u'\0';
}